

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O1

void __thiscall gvr::MultiTexturedMesh::MultiTexturedMesh(MultiTexturedMesh *this)

{
  Mesh::Mesh(&this->super_Mesh);
  (this->super_Mesh).super_PointCloud.super_Model._vptr_Model =
       (_func_int **)&PTR__MultiTexturedMesh_00178338;
  (this->basepath)._M_dataplus._M_p = (pointer)&(this->basepath).field_2;
  (this->basepath)._M_string_length = 0;
  (this->basepath).field_2._M_local_buf[0] = '\0';
  (this->name).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->uvt = (UVT *)0x0;
  return;
}

Assistant:

MultiTexturedMesh::MultiTexturedMesh()
{
  uvt=0;
}